

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallTargetGenerator::AddRPathCheckRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,
          string *toDestDirPath)

{
  bool bVar1;
  PolicyStatus PVar2;
  cmMakefile *this_00;
  cmComputeLinkInformation *this_01;
  ostream *poVar3;
  WrapQuotes wrapQuotes;
  string_view str;
  string newRpath;
  string local_70;
  string local_50;
  
  wrapQuotes = (WrapQuotes)toDestDirPath;
  if ((this->ImportLibrary == false) && (this->NamelinkMode != NamelinkModeOnly)) {
    bVar1 = cmGeneratorTarget::IsChrpathUsed(this->Target,config);
    if (bVar1) {
      this_00 = cmTarget::GetMakefile(this->Target->Target);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"CMAKE_PLATFORM_HAS_INSTALLNAME",(allocator<char> *)&local_50);
      bVar1 = cmMakefile::IsOn(this_00,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      if (!bVar1) {
        this_01 = cmGeneratorTarget::GetLinkInformation(this->Target,config);
        if (this_01 != (cmComputeLinkInformation *)0x0) {
          poVar3 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
          poVar3 = std::operator<<(poVar3,"file(RPATH_CHECK\n");
          poVar3 = operator<<(poVar3,(cmScriptGeneratorIndent)indent.Level);
          poVar3 = std::operator<<(poVar3,"     FILE \"");
          poVar3 = std::operator<<(poVar3,(string *)toDestDirPath);
          std::operator<<(poVar3,"\"\n");
          PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0095(this->Target);
          if (PVar2 < NEW) {
            cmComputeLinkInformation::GetChrpathString_abi_cxx11_(&local_70,this_01);
            poVar3 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
            poVar3 = std::operator<<(poVar3,"     RPATH \"");
            poVar3 = std::operator<<(poVar3,(string *)&local_70);
            std::operator<<(poVar3,"\")\n");
          }
          else {
            cmComputeLinkInformation::GetChrpathString_abi_cxx11_(&local_50,this_01);
            str._M_str = (char *)0x0;
            str._M_len = (size_t)local_50._M_dataplus._M_p;
            cmOutputConverter::EscapeForCMake_abi_cxx11_
                      (&local_70,(cmOutputConverter *)local_50._M_string_length,str,wrapQuotes);
            std::__cxx11::string::~string((string *)&local_50);
            poVar3 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
            poVar3 = std::operator<<(poVar3,"     RPATH ");
            poVar3 = std::operator<<(poVar3,(string *)&local_70);
            std::operator<<(poVar3,")\n");
          }
          std::__cxx11::string::~string((string *)&local_70);
        }
      }
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddRPathCheckRule(
  std::ostream& os, Indent indent, const std::string& config,
  std::string const& toDestDirPath)
{
  // Skip the chrpath if the target does not need it.
  if (this->ImportLibrary || this->NamelinkMode == NamelinkModeOnly ||
      !this->Target->IsChrpathUsed(config)) {
    return;
  }
  // Skip if on Apple
  if (this->Target->Target->GetMakefile()->IsOn(
        "CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    return;
  }

  // Get the link information for this target.
  // It can provide the RPATH.
  cmComputeLinkInformation* cli = this->Target->GetLinkInformation(config);
  if (!cli) {
    return;
  }

  // Write a rule to remove the installed file if its rpath is not the
  // new rpath.  This is needed for existing build/install trees when
  // the installed rpath changes but the file is not rebuilt.
  os << indent << "file(RPATH_CHECK\n"
     << indent << "     FILE \"" << toDestDirPath << "\"\n";

  // CMP0095: ``RPATH`` entries are properly escaped in the intermediary
  // CMake install script.
  switch (this->Target->GetPolicyStatusCMP0095()) {
    case cmPolicies::WARN:
      // No author warning needed here, we warn later in
      // cmInstallTargetGenerator::AddChrpathPatchRule().
      CM_FALLTHROUGH;
    case cmPolicies::OLD: {
      // Get the install RPATH from the link information.
      std::string newRpath = cli->GetChrpathString();
      os << indent << "     RPATH \"" << newRpath << "\")\n";
      break;
    }
    default: {
      // Get the install RPATH from the link information and
      // escape any CMake syntax in the install RPATH.
      std::string escapedNewRpath =
        cmOutputConverter::EscapeForCMake(cli->GetChrpathString());
      os << indent << "     RPATH " << escapedNewRpath << ")\n";
      break;
    }
  }
}